

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_NtkRetimeCreateDelayInfo(Wln_Ntk_t *pNtk)

{
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint i;
  long lVar5;
  long lVar6;
  
  p = &pNtk->vTypes;
  if ((pNtk->vInstIds).nSize < 1) {
    puts("The design has no delay information.");
    p_00 = &pNtk->vInstIds;
    Vec_IntFill(p_00,(pNtk->vTypes).nCap,0);
    lVar6 = 0x14;
    for (lVar5 = 1; lVar5 < (pNtk->vTypes).nSize; lVar5 = lVar5 + 1) {
      iVar3 = (int)lVar5;
      iVar1 = Wln_ObjIsFf(pNtk,iVar3);
      iVar2 = 1;
      if (((iVar1 != 0) || (iVar1 = Vec_IntEntry(p,iVar3), iVar1 == 0x5b)) ||
         ((iVar1 = Vec_IntEntry(p,iVar3), iVar1 == 0x5c ||
          ((iVar1 = Wln_ObjIsCio(pNtk,iVar3), iVar1 == 0 &&
           (iVar2 = 10, 0 < *(int *)((long)&pNtk->vFanins->nCap + lVar6))))))) {
        Vec_IntWriteEntry(p_00,iVar3,iVar2);
      }
      lVar6 = lVar6 + 0x10;
    }
    for (iVar1 = 0; iVar1 < (pNtk->vCos).nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(&pNtk->vCos,iVar1);
      iVar3 = Wln_ObjFanin0(pNtk,iVar2);
      iVar3 = Vec_IntEntry(p,iVar3);
      if (iVar3 != 0x4b) {
        iVar2 = Wln_ObjFanin0(pNtk,iVar2);
        Vec_IntWriteEntry(p_00,iVar2,1);
      }
    }
    puts(
        "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs."
        );
    return;
  }
  puts("Using delays given by the user in the input file.");
  for (i = 1; (int)i < (pNtk->vTypes).nSize; i = i + 1) {
    iVar1 = Wln_ObjIsCio(pNtk,i);
    if (((iVar1 == 0) && (iVar1 = Vec_IntEntry(p,i), iVar1 != 0x61)) &&
       (iVar1 = Vec_IntEntry(&pNtk->vInstIds,i), iVar1 == 0)) {
      iVar1 = Vec_IntEntry(p,i);
      pcVar4 = Abc_OperName(iVar1);
      printf("Warning: Object %d of type %s has zero delay. Retiming will not work correctly.\n",
             (ulong)i,pcVar4);
    }
  }
  return;
}

Assistant:

void Wln_NtkRetimeCreateDelayInfo( Wln_Ntk_t * pNtk )
{
    int i, iObj;
//    if ( Wln_NtkHasInstId(pNtk) )
//        Vec_IntErase( &pNtk->vInstIds );
    if ( Wln_NtkHasInstId(pNtk) )
    {
        printf( "Using delays given by the user in the input file.\n" );
        Wln_NtkForEachObj( pNtk, iObj )
            if ( !Wln_ObjIsCio(pNtk, iObj) && !Wln_ObjIsConst(pNtk, iObj) && Wln_ObjInstId(pNtk, iObj) == 0 )
                printf( "Warning: Object %d of type %s has zero delay. Retiming will not work correctly.\n", iObj, Abc_OperName(Wln_ObjType(pNtk, iObj)) );
    }
    else
    {
        printf( "The design has no delay information.\n" );
        Wln_NtkCleanInstId(pNtk);
        Wln_NtkForEachObj( pNtk, iObj )
        {
            if ( Wln_ObjIsFf(pNtk, iObj) || Wln_ObjType(pNtk, iObj) == ABC_OPER_SLICE || Wln_ObjType(pNtk, iObj) == ABC_OPER_CONCAT )
                Wln_ObjSetInstId( pNtk, iObj, 1 );
            else if ( !Wln_ObjIsCio(pNtk, iObj) && Wln_ObjFaninNum(pNtk, iObj) > 0 )
                Wln_ObjSetInstId( pNtk, iObj, 10 );
        }
        Wln_NtkForEachCo( pNtk, iObj, i ) 
        {
            if ( Wln_ObjType(pNtk, Wln_ObjFanin0(pNtk, iObj)) != ABC_OPER_LUT )
                Wln_ObjSetInstId( pNtk, Wln_ObjFanin0(pNtk, iObj), 1 );
        }
        printf( "Assuming default delays: 10 units for most nodes and 1 unit for bit-slice, concat, and buffers driving COs.\n" );
    }
}